

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.cpp
# Opt level: O0

void __thiscall CParticles::OnRender(CParticles *this)

{
  int iVar1;
  IClient *this_00;
  int64 iVar2;
  CGameClient *this_01;
  float unaff_retaddr;
  CParticles *in_stack_00000008;
  int64 Now;
  
  this_00 = CComponent::Client((CComponent *)0x1b44ac);
  iVar1 = IClient::State(this_00);
  if (2 < iVar1) {
    iVar2 = time_get();
    if ((OnRender()::s_LastTime == '\0') &&
       (iVar1 = __cxa_guard_acquire(&OnRender()::s_LastTime), iVar1 != 0)) {
      OnRender::s_LastTime = iVar2;
      __cxa_guard_release(&OnRender()::s_LastTime);
    }
    this_01 = (CGameClient *)(double)(iVar2 - OnRender::s_LastTime);
    time_freq();
    CGameClient::GetAnimationPlaybackSpeed(this_01);
    Update(in_stack_00000008,unaff_retaddr);
    OnRender::s_LastTime = iVar2;
  }
  return;
}

Assistant:

void CParticles::OnRender()
{
	if(Client()->State() < IClient::STATE_ONLINE)
		return;

	int64 Now = time_get();
	static int64 s_LastTime = Now;
	Update((float)((Now-s_LastTime)/(double)time_freq()) * m_pClient->GetAnimationPlaybackSpeed());
	s_LastTime = Now;
}